

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

string * __thiscall
t_cpp_generator::type_to_enum_abi_cxx11_
          (string *__return_storage_ptr__,t_cpp_generator *this,t_type *type)

{
  int iVar1;
  t_type *ptVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var;
  undefined8 *puVar3;
  allocator *paVar4;
  char *pcVar5;
  allocator local_1d;
  allocator local_1c;
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  allocator local_18;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  
  ptVar2 = t_type::get_true_type(type);
  iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[5])(ptVar2);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[10])(ptVar2);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xb])(ptVar2);
      if ((char)iVar1 == '\0') {
        iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xc])(ptVar2);
        if ((char)iVar1 == '\0') {
          iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0x10])(ptVar2);
          if ((char)iVar1 == '\0') {
            iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xf])(ptVar2);
            if ((char)iVar1 == '\0') {
              iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xe])(ptVar2);
              if ((char)iVar1 == '\0') goto switchD_00172c4b_default;
              pcVar5 = "::apache::thrift::protocol::T_LIST";
              paVar4 = &local_1d;
            }
            else {
              pcVar5 = "::apache::thrift::protocol::T_SET";
              paVar4 = &local_1c;
            }
          }
          else {
            pcVar5 = "::apache::thrift::protocol::T_MAP";
            paVar4 = &local_1b;
          }
        }
        else {
          pcVar5 = "::apache::thrift::protocol::T_STRUCT";
          paVar4 = &local_1a;
        }
      }
      else {
        pcVar5 = "::apache::thrift::protocol::T_STRUCT";
        paVar4 = &local_19;
      }
    }
    else {
      pcVar5 = "::apache::thrift::protocol::T_I32";
      paVar4 = &local_18;
    }
  }
  else {
    switch(*(undefined4 *)&ptVar2[1].super_t_doc._vptr_t_doc) {
    case 0:
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "NO T_VOID CONSTRUCT";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    case 1:
      pcVar5 = "::apache::thrift::protocol::T_STRING";
      paVar4 = &local_11;
      break;
    case 2:
      pcVar5 = "::apache::thrift::protocol::T_BOOL";
      paVar4 = &local_12;
      break;
    case 3:
      pcVar5 = "::apache::thrift::protocol::T_BYTE";
      paVar4 = &local_13;
      break;
    case 4:
      pcVar5 = "::apache::thrift::protocol::T_I16";
      paVar4 = &local_14;
      break;
    case 5:
      pcVar5 = "::apache::thrift::protocol::T_I32";
      paVar4 = &local_15;
      break;
    case 6:
      pcVar5 = "::apache::thrift::protocol::T_I64";
      paVar4 = &local_16;
      break;
    case 7:
      pcVar5 = "::apache::thrift::protocol::T_DOUBLE";
      paVar4 = &local_17;
      break;
    default:
switchD_00172c4b_default:
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[3])(ptVar2);
      std::operator+(__return_storage_ptr___00,"INVALID TYPE IN type_to_enum: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar1));
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,paVar4);
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::type_to_enum(t_type* type) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "NO T_VOID CONSTRUCT";
    case t_base_type::TYPE_STRING:
      return "::apache::thrift::protocol::T_STRING";
    case t_base_type::TYPE_BOOL:
      return "::apache::thrift::protocol::T_BOOL";
    case t_base_type::TYPE_I8:
      return "::apache::thrift::protocol::T_BYTE";
    case t_base_type::TYPE_I16:
      return "::apache::thrift::protocol::T_I16";
    case t_base_type::TYPE_I32:
      return "::apache::thrift::protocol::T_I32";
    case t_base_type::TYPE_I64:
      return "::apache::thrift::protocol::T_I64";
    case t_base_type::TYPE_DOUBLE:
      return "::apache::thrift::protocol::T_DOUBLE";
    }
  } else if (type->is_enum()) {
    return "::apache::thrift::protocol::T_I32";
  } else if (type->is_struct()) {
    return "::apache::thrift::protocol::T_STRUCT";
  } else if (type->is_xception()) {
    return "::apache::thrift::protocol::T_STRUCT";
  } else if (type->is_map()) {
    return "::apache::thrift::protocol::T_MAP";
  } else if (type->is_set()) {
    return "::apache::thrift::protocol::T_SET";
  } else if (type->is_list()) {
    return "::apache::thrift::protocol::T_LIST";
  }

  throw "INVALID TYPE IN type_to_enum: " + type->get_name();
}